

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3ca8ed::Nrom_creation_fails_with_bad_rom_sizes_Test::
~Nrom_creation_fails_with_bad_rom_sizes_Test(Nrom_creation_fails_with_bad_rom_sizes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Nrom, creation_fails_with_bad_rom_sizes) {
    std::string bytes{nrom_bytes(0, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);

    bytes = nrom_bytes(1, 1, Mapper::Nrom);
    bytes.pop_back();
    ss = std::stringstream(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);

    bytes = nrom_bytes(3, 1, Mapper::Nrom);
    ss = std::stringstream(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);

    bytes = nrom_bytes(1, 2, Mapper::Nrom);
    ss = std::stringstream(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);
}